

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_color.c
# Opt level: O0

void swap_yuv2yuv420(swap_image_yuv_t *im)

{
  ulong uVar1;
  ulong uVar2;
  uchar *puVar3;
  uchar *puVar4;
  long lVar5;
  size_t idx;
  int val;
  uchar *v;
  uchar *u;
  size_t j;
  size_t i;
  size_t h;
  size_t w;
  swap_image_yuv_t *im_local;
  
  uVar1 = im->w;
  uVar2 = im->h;
  puVar3 = im->u;
  puVar4 = im->v;
  for (j = 0; j < uVar2; j = j + 2) {
    for (i = 0; i < uVar1; i = i + 2) {
      lVar5 = (j >> 1) * (uVar1 >> 1) + (i >> 1);
      val = (int)((uint)puVar3[j * uVar1 + i] + (uint)puVar3[j * uVar1 + i + 1] +
                  (uint)puVar3[(j + 1) * uVar1 + i] + (uint)puVar3[(j + 1) * uVar1 + i + 1] + 2) >>
            2;
      if (0xff < (uint)val) {
        val = 0xff;
      }
      puVar3[lVar5] = (uchar)val;
      val = (int)((uint)puVar4[j * uVar1 + i] + (uint)puVar4[j * uVar1 + i + 1] +
                  (uint)puVar4[(j + 1) * uVar1 + i] + (uint)puVar4[(j + 1) * uVar1 + i + 1] + 2) >>
            2;
      if (0xff < (uint)val) {
        val = 0xff;
      }
      puVar4[lVar5] = (uchar)val;
    }
  }
  return;
}

Assistant:

void swap_yuv2yuv420(swap_image_yuv_t *im) {
    size_t w = im->w, h = im->h, i, j;
    unsigned char *u = im->u, *v = im->v;

    for (j = 0; j < h; j += 2)
        for (i = 0; i < w; i += 2) {
            int val;
            size_t idx = (j / 2) * (w / 2) + (i / 2);

            val = ((int) u[j * w + i] +
                   (int) u[j * w + (i + 1)] + (int) u[(j + 1) * w + i] + (int) u[(j + 1) * w + (i + 1)] + 2) >> 2;
            if (val > 255)
                val = 255;
            u[idx] = val;

            val = ((int) v[j * w + i] +
                   (int) v[j * w + (i + 1)] + (int) v[(j + 1) * w + i] + (int) v[(j + 1) * w + (i + 1)] + 2) >> 2;
            if (val > 255)
                val = 255;
            v[idx] = val;
        }
}